

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

optional<pbrt::ShapeSample> * __thiscall
pbrt::BilinearPatch::Sample(BilinearPatch *this,ShapeSampleContext *ctx,Point2f u)

{
  Vector3f *ex;
  undefined1 auVar1 [16];
  initializer_list<float> v_00;
  span<const_float> w_00;
  span<const_float> w_01;
  Point2f p_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Point2f u_00;
  bool bVar7;
  enable_if_t<std::is_floating_point<float>::value,_bool> eVar8;
  float *pfVar9;
  ShapeSample *pSVar10;
  optional<pbrt::ShapeSample> *v_01;
  long in_RDX;
  Vector3f *in_RSI;
  optional<pbrt::ShapeSample> *in_RDI;
  Float FVar11;
  float fVar12;
  type tVar13;
  undefined8 uVar49;
  undefined1 in_ZMM0 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined8 uVar50;
  undefined1 extraout_var_00 [56];
  undefined1 auVar48 [64];
  Point3f PVar52;
  Vector3<float> VVar53;
  Vector3f wi;
  optional<pbrt::ShapeSample> ss;
  Point2f uv;
  Normal3f n;
  Point3f p;
  Float quadPDF;
  array<float,_4> w;
  Point3f rp;
  Float pdf;
  Vector3f v11;
  Vector3f v01;
  Vector3f v10;
  Vector3f v00;
  Point3f *p11;
  Point3f *p01;
  Point3f *p10;
  Point3f *p00;
  int *v;
  BilinearPatchMesh *mesh;
  float in_stack_fffffffffffff788;
  float in_stack_fffffffffffff78c;
  undefined7 in_stack_fffffffffffff790;
  undefined1 in_stack_fffffffffffff797;
  array<float,_4> *in_stack_fffffffffffff798;
  undefined4 in_stack_fffffffffffff7a0;
  undefined4 in_stack_fffffffffffff7a4;
  Point3fi *in_stack_fffffffffffff7a8;
  undefined4 in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b4;
  array<float,_4> *in_stack_fffffffffffff7c0;
  undefined8 in_stack_fffffffffffff7c8;
  undefined4 in_stack_fffffffffffff7d0;
  undefined4 in_stack_fffffffffffff7d4;
  undefined1 in_stack_fffffffffffff7e8 [12];
  undefined4 in_stack_fffffffffffff7f4;
  undefined4 in_stack_fffffffffffff7f8;
  float in_stack_fffffffffffff7fc;
  float in_stack_fffffffffffff800;
  undefined4 in_stack_fffffffffffff804;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffff808;
  BilinearPatch *this_00;
  Point3f *pPVar54;
  Vector3f *in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff938;
  undefined4 in_stack_fffffffffffff93c;
  Tuple3<pbrt::Vector3,_float> local_600 [2];
  undefined8 local_5e8;
  float local_518;
  Tuple3<pbrt::Vector3,_float> local_510;
  Tuple3<pbrt::Vector3,_float> local_4fc;
  Tuple3<pbrt::Vector3,_float> local_4f0;
  Tuple3<pbrt::Vector3,_float> local_4e0;
  Tuple3<pbrt::Vector3,_float> local_4d0;
  Tuple3<pbrt::Vector3,_float> local_4c0;
  Tuple3<pbrt::Vector3,_float> local_4b0;
  Tuple3<pbrt::Vector3,_float> local_4a0 [2];
  undefined8 local_488;
  float local_480;
  undefined8 local_478;
  float local_470;
  undefined8 local_468;
  float local_460;
  undefined8 local_458;
  float local_450;
  undefined8 local_448;
  float local_440;
  undefined8 local_438;
  float local_430;
  undefined8 local_428;
  float local_420;
  undefined8 local_418;
  float local_410;
  Tuple3<pbrt::Normal3,float> local_40c [12];
  undefined8 local_400;
  undefined4 in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc0c;
  undefined4 in_stack_fffffffffffffc1c;
  undefined4 in_stack_fffffffffffffc2c;
  float local_384;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  float in_stack_fffffffffffffcf8;
  float in_stack_fffffffffffffcfc;
  type local_2c0;
  float local_2bc;
  undefined8 local_2b8;
  float local_2b0;
  undefined8 local_2a8;
  float local_2a0;
  undefined8 local_298;
  float local_290;
  undefined8 local_288;
  float local_280;
  type local_278;
  float local_274;
  undefined8 local_270;
  float local_268;
  undefined8 local_260;
  float local_258;
  undefined8 local_250;
  float local_248;
  undefined8 local_240;
  float local_238;
  type local_230;
  float local_22c;
  float local_228;
  float local_224;
  float local_220;
  float local_21c;
  float *local_218;
  undefined8 local_210;
  undefined8 local_1f8;
  float local_1f0;
  undefined8 local_1e8;
  float local_1e0;
  Normal3<float> local_1d8;
  float local_1cc;
  undefined8 local_1c8;
  float local_1c0;
  undefined8 local_1b8;
  float local_1b0;
  undefined8 local_1a8;
  float local_1a0;
  undefined8 local_198;
  float local_190;
  undefined8 local_188;
  float local_180;
  undefined8 local_17c;
  float local_174;
  undefined8 local_170;
  float local_168;
  undefined8 local_160;
  float local_158;
  undefined8 local_150;
  float local_148;
  undefined8 local_140;
  float local_138;
  undefined8 local_130;
  float local_128;
  undefined8 local_120;
  float local_118;
  undefined8 local_110;
  float local_108;
  undefined8 local_100;
  float local_f8;
  undefined8 local_f0;
  float local_e8;
  undefined8 local_e0;
  float local_d8;
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a0;
  float local_98;
  undefined8 local_90;
  float local_88;
  undefined8 local_80;
  float local_78;
  undefined8 local_70;
  float local_68;
  undefined8 local_60;
  float local_58;
  Point3f *local_50;
  Point3f *local_48;
  Point3f *local_40;
  BilinearPatch *local_38;
  int *local_30;
  BilinearPatchMesh *local_28;
  long local_20;
  undefined8 local_10;
  undefined1 auVar51 [56];
  undefined1 extraout_var [56];
  
  auVar51 = in_ZMM0._8_56_;
  local_10 = vmovlpd_avx(in_ZMM0._0_16_);
  local_20 = in_RDX;
  local_28 = GetMesh((BilinearPatch *)0x797bf0);
  local_30 = local_28->vertexIndices + ((int)(in_RSI->super_Tuple3<pbrt::Vector3,_float>).y << 2);
  this_00 = (BilinearPatch *)(local_28->p + *local_30);
  local_40 = local_28->p + local_30[1];
  local_48 = local_28->p + local_30[2];
  local_50 = local_28->p + local_30[3];
  local_38 = this_00;
  PVar52 = ShapeSampleContext::p
                     ((ShapeSampleContext *)
                      CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790));
  local_88 = PVar52.super_Tuple3<pbrt::Point3,_float>.z;
  auVar14._0_8_ = PVar52.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar14._8_56_ = auVar51;
  local_90 = vmovlpd_avx(auVar14._0_16_);
  local_80 = local_90;
  local_78 = local_88;
  VVar53 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0)
                      ,(Point3<float> *)in_stack_fffffffffffff798);
  local_98 = VVar53.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar15._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar15._8_56_ = auVar51;
  local_a0 = vmovlpd_avx(auVar15._0_16_);
  local_70 = local_a0;
  local_68 = local_98;
  VVar53 = Normalize<float>((Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
  local_a8 = VVar53.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar16._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar16._8_56_ = auVar51;
  local_b0 = vmovlpd_avx(auVar16._0_16_);
  local_60 = local_b0;
  local_58 = local_a8;
  PVar52 = ShapeSampleContext::p
                     ((ShapeSampleContext *)
                      CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790));
  local_e8 = PVar52.super_Tuple3<pbrt::Point3,_float>.z;
  auVar17._0_8_ = PVar52.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar17._8_56_ = auVar51;
  local_f0 = vmovlpd_avx(auVar17._0_16_);
  local_e0 = local_f0;
  local_d8 = local_e8;
  VVar53 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0)
                      ,(Point3<float> *)in_stack_fffffffffffff798);
  local_f8 = VVar53.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar18._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar18._8_56_ = auVar51;
  local_100 = vmovlpd_avx(auVar18._0_16_);
  local_d0 = local_100;
  local_c8 = local_f8;
  VVar53 = Normalize<float>((Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
  local_108 = VVar53.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar19._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar19._8_56_ = auVar51;
  local_110 = vmovlpd_avx(auVar19._0_16_);
  local_c0 = local_110;
  local_b8 = local_108;
  PVar52 = ShapeSampleContext::p
                     ((ShapeSampleContext *)
                      CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790));
  local_148 = PVar52.super_Tuple3<pbrt::Point3,_float>.z;
  auVar20._0_8_ = PVar52.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar20._8_56_ = auVar51;
  local_150 = vmovlpd_avx(auVar20._0_16_);
  local_140 = local_150;
  local_138 = local_148;
  VVar53 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0)
                      ,(Point3<float> *)in_stack_fffffffffffff798);
  local_158 = VVar53.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar21._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar21._8_56_ = auVar51;
  local_160 = vmovlpd_avx(auVar21._0_16_);
  local_130 = local_160;
  local_128 = local_158;
  VVar53 = Normalize<float>((Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
  local_168 = VVar53.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar22._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar22._8_56_ = auVar51;
  local_170 = vmovlpd_avx(auVar22._0_16_);
  pPVar54 = local_50;
  local_120 = local_170;
  local_118 = local_168;
  PVar52 = ShapeSampleContext::p
                     ((ShapeSampleContext *)
                      CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790));
  local_1a0 = PVar52.super_Tuple3<pbrt::Point3,_float>.z;
  auVar23._0_8_ = PVar52.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar23._8_56_ = auVar51;
  local_1a8 = vmovlpd_avx(auVar23._0_16_);
  local_198 = local_1a8;
  local_190 = local_1a0;
  VVar53 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0)
                      ,(Point3<float> *)in_stack_fffffffffffff798);
  local_1b0 = VVar53.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar24._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar24._8_56_ = auVar51;
  local_1b8 = vmovlpd_avx(auVar24._0_16_);
  local_188 = local_1b8;
  local_180 = local_1b0;
  VVar53 = Normalize<float>((Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
  local_1c0 = VVar53.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar25._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar25._8_56_ = auVar51;
  local_1c8 = vmovlpd_avx(auVar25._0_16_);
  local_17c = local_1c8;
  local_174 = local_1c0;
  bVar7 = IsRectangle(this_00);
  if (((!bVar7) || (local_28->imageDistribution != (PiecewiseConstant2D *)0x0)) ||
     (FVar11 = SphericalQuadArea((Vector3f *)
                                 CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                                 in_stack_fffffffffffff930,in_RSI,(Vector3f *)pPVar54),
     FVar11 <= 0.0001)) {
    local_5e8 = local_10;
    u_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffcfc;
    u_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffcf8;
    Sample((BilinearPatch *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),u_00);
    FVar11 = *(Float *)(local_20 + 0x30);
    pSVar10 = pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x798a7f)
    ;
    uVar49 = 0;
    (pSVar10->intr).time = FVar11;
    pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x798aac);
    PVar52 = Interaction::p((Interaction *)
                            CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790));
    uVar50 = 0;
    auVar6._8_8_ = uVar49;
    auVar6._0_8_ = PVar52.super_Tuple3<pbrt::Point3,_float>._0_8_;
    vmovlpd_avx(auVar6);
    PVar52 = ShapeSampleContext::p
                       ((ShapeSampleContext *)
                        CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790));
    uVar49 = 0;
    auVar5._8_8_ = uVar50;
    auVar5._0_8_ = PVar52.super_Tuple3<pbrt::Point3,_float>._0_8_;
    vmovlpd_avx(auVar5);
    VVar53 = Point3<float>::operator-
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                        (Point3<float> *)in_stack_fffffffffffff798);
    local_600[0].z = VVar53.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar4._8_8_ = uVar49;
    auVar4._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    local_600[0]._0_8_ = vmovlpd_avx(auVar4);
    fVar12 = LengthSquared<float>((Vector3<float> *)local_600);
    uVar49 = 0;
    if ((fVar12 != 0.0) || (NAN(fVar12))) {
      VVar53 = Normalize<float>((Vector3<float> *)
                                CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
      local_600[0].z = VVar53.super_Tuple3<pbrt::Vector3,_float>.z;
      uVar50 = 0;
      auVar3._8_8_ = uVar49;
      auVar3._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      local_600[0]._0_8_ = vmovlpd_avx(auVar3);
      pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x798cf9);
      VVar53 = Tuple3<pbrt::Vector3,_float>::operator-
                         ((Tuple3<pbrt::Vector3,_float> *)
                          CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790));
      auVar2._8_8_ = uVar50;
      auVar2._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      vmovlpd_avx(auVar2);
      tVar13 = AbsDot<float>((Normal3<float> *)
                             CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790),
                             (Vector3<float> *)
                             CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
      auVar51 = extraout_var_00;
      PVar52 = ShapeSampleContext::p
                         ((ShapeSampleContext *)
                          CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790));
      auVar48._0_8_ = PVar52.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar48._8_56_ = auVar51;
      uVar49 = 0;
      vmovlpd_avx(auVar48._0_16_);
      pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x798def);
      PVar52 = Interaction::p((Interaction *)
                              CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790));
      auVar1._8_8_ = uVar49;
      auVar1._0_8_ = PVar52.super_Tuple3<pbrt::Point3,_float>._0_8_;
      vmovlpd_avx(auVar1);
      fVar12 = DistanceSquared<float>
                         ((Point3<float> *)
                          CONCAT44(PVar52.super_Tuple3<pbrt::Point3,_float>.z,
                                   in_stack_fffffffffffff7b0),
                          (Point3<float> *)in_stack_fffffffffffff7a8);
      fVar12 = tVar13 / fVar12;
      pSVar10 = pstd::optional<pbrt::ShapeSample>::operator->
                          ((optional<pbrt::ShapeSample> *)0x798e8a);
      pSVar10->pdf = pSVar10->pdf / fVar12;
      v_01 = (optional<pbrt::ShapeSample> *)
             pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x798eb7);
      eVar8 = IsInf<float>(0.0);
      if (eVar8) {
        memset(in_RDI,0,0x60);
        pstd::optional<pbrt::ShapeSample>::optional(in_RDI);
      }
      else {
        pstd::optional<pbrt::ShapeSample>::optional
                  ((optional<pbrt::ShapeSample> *)CONCAT44(fVar12,in_stack_fffffffffffff7a0),v_01);
      }
    }
    else {
      memset(in_RDI,0,0x60);
      pstd::optional<pbrt::ShapeSample>::optional(in_RDI);
    }
    pstd::optional<pbrt::ShapeSample>::~optional((optional<pbrt::ShapeSample> *)0x798f3a);
  }
  else {
    local_1cc = 1.0;
    auVar51 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
    Normal3<float>::Normal3
              ((Normal3<float> *)CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790),
               in_stack_fffffffffffff78c,in_stack_fffffffffffff788,0.0);
    bVar7 = Tuple3<pbrt::Normal3,_float>::operator!=
                      ((Tuple3<pbrt::Normal3,_float> *)(local_20 + 0x24),&local_1d8);
    if (bVar7) {
      PVar52 = ShapeSampleContext::p
                         ((ShapeSampleContext *)
                          CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790));
      local_1f0 = PVar52.super_Tuple3<pbrt::Point3,_float>.z;
      auVar26._0_8_ = PVar52.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar26._8_56_ = auVar51;
      local_1f8 = vmovlpd_avx(auVar26._0_16_);
      local_22c = 0.01;
      local_1e8 = local_1f8;
      local_1e0 = local_1f0;
      VVar53 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                          (Point3<float> *)in_stack_fffffffffffff798);
      local_258 = VVar53.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar27._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar27._8_56_ = auVar51;
      local_260 = vmovlpd_avx(auVar27._0_16_);
      local_250 = local_260;
      local_248 = local_258;
      VVar53 = Normalize<float>((Vector3<float> *)
                                CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
      local_268 = VVar53.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar28._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar28._8_56_ = auVar51;
      local_270 = vmovlpd_avx(auVar28._0_16_);
      local_240 = local_270;
      local_238 = local_268;
      local_230 = AbsDot<float>((Vector3<float> *)
                                CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790),
                                (Normal3<float> *)
                                CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
      pfVar9 = std::max<float>(&local_22c,&local_230);
      local_228 = *pfVar9;
      auVar51 = (undefined1  [56])0x0;
      local_274 = 0.01;
      VVar53 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                          (Point3<float> *)in_stack_fffffffffffff798);
      local_2a0 = VVar53.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar29._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar29._8_56_ = auVar51;
      local_2a8 = vmovlpd_avx(auVar29._0_16_);
      local_298 = local_2a8;
      local_290 = local_2a0;
      VVar53 = Normalize<float>((Vector3<float> *)
                                CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
      local_2b0 = VVar53.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar30._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar30._8_56_ = auVar51;
      local_2b8 = vmovlpd_avx(auVar30._0_16_);
      local_288 = local_2b8;
      local_280 = local_2b0;
      local_278 = AbsDot<float>((Vector3<float> *)
                                CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790),
                                (Normal3<float> *)
                                CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
      pfVar9 = std::max<float>(&local_274,&local_278);
      local_224 = *pfVar9;
      auVar51 = (undefined1  [56])0x0;
      local_2bc = 0.01;
      VVar53 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                          (Point3<float> *)in_stack_fffffffffffff798);
      auVar31._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar31._8_56_ = auVar51;
      vmovlpd_avx(auVar31._0_16_);
      VVar53 = Normalize<float>((Vector3<float> *)
                                CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
      auVar32._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar32._8_56_ = auVar51;
      vmovlpd_avx(auVar32._0_16_);
      local_2c0 = AbsDot<float>((Vector3<float> *)
                                CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790),
                                (Normal3<float> *)
                                CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
      pfVar9 = std::max<float>(&local_2bc,&local_2c0);
      local_220 = *pfVar9;
      auVar51 = (undefined1  [56])0x0;
      VVar53 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                          (Point3<float> *)in_stack_fffffffffffff798);
      auVar33._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar33._8_56_ = auVar51;
      vmovlpd_avx(auVar33._0_16_);
      VVar53 = Normalize<float>((Vector3<float> *)
                                CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
      auVar34._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar34._8_56_ = auVar51;
      vmovlpd_avx(auVar34._0_16_);
      AbsDot<float>((Vector3<float> *)CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790),
                    (Normal3<float> *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788))
      ;
      pfVar9 = std::max<float>((float *)&stack0xfffffffffffffcfc,(float *)&stack0xfffffffffffffcf8);
      local_21c = *pfVar9;
      local_218 = &local_228;
      local_210 = 4;
      v_00._M_len._0_4_ = in_stack_fffffffffffff7d0;
      v_00._M_array = (iterator)in_stack_fffffffffffff7c8;
      v_00._M_len._4_4_ = in_stack_fffffffffffff7d4;
      pstd::array<float,_4>::array(in_stack_fffffffffffff7c0,v_00);
      pstd::span<float_const>::span<pstd::array<float,4>,void,pstd::array<float,4>>
                ((span<const_float> *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                 in_stack_fffffffffffff798);
      w_01.ptr._4_4_ = in_stack_fffffffffffff7fc;
      w_01.ptr._0_4_ = in_stack_fffffffffffff7f8;
      w_01.n._0_4_ = in_stack_fffffffffffff800;
      w_01.n._4_4_ = in_stack_fffffffffffff804;
      auVar35._0_8_ = SampleBilinear(in_stack_fffffffffffff808,w_01);
      auVar35._8_56_ = extraout_var;
      local_10 = vmovlpd_avx(auVar35._0_16_);
      pstd::span<float_const>::span<pstd::array<float,4>,void,pstd::array<float,4>>
                ((span<const_float> *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                 in_stack_fffffffffffff798);
      p_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffff800;
      p_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffff7fc;
      w_00.n._4_4_ = in_stack_fffffffffffff7f4;
      w_00._0_12_ = in_stack_fffffffffffff7e8;
      FVar11 = BilinearPDF(p_00,w_00);
      local_1cc = FVar11 * local_1cc;
      auVar51 = (undefined1  [56])0x0;
    }
    PVar52 = ShapeSampleContext::p
                       ((ShapeSampleContext *)
                        CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790));
    auVar36._0_8_ = PVar52.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar36._8_56_ = auVar51;
    vmovlpd_avx(auVar36._0_16_);
    VVar53 = Point3<float>::operator-
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                        (Point3<float> *)in_stack_fffffffffffff798);
    auVar37._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar37._8_56_ = auVar51;
    pPVar54 = (Point3f *)vmovlpd_avx(auVar37._0_16_);
    VVar53 = Point3<float>::operator-
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                        (Point3<float> *)in_stack_fffffffffffff798);
    auVar38._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar38._8_56_ = auVar51;
    ex = (Vector3f *)vmovlpd_avx(auVar38._0_16_);
    PVar52 = SampleSphericalRectangle
                       (pPVar54,(Point3f *)
                                CONCAT44(in_stack_fffffffffffffc2c,
                                         VVar53.super_Tuple3<pbrt::Vector3,_float>.z),ex,
                        (Vector3f *)
                        CONCAT44(in_stack_fffffffffffffc1c,
                                 VVar53.super_Tuple3<pbrt::Vector3,_float>.z),(Point2f *)ex,
                        (Float *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
    auVar39._0_8_ = PVar52.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar39._8_56_ = auVar51;
    local_400 = vmovlpd_avx(auVar39._0_16_);
    local_1cc = local_1cc * local_384;
    auVar51 = (undefined1  [56])0x0;
    VVar53 = Point3<float>::operator-
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                        (Point3<float> *)in_stack_fffffffffffff798);
    local_440 = VVar53.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar40._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar40._8_56_ = auVar51;
    local_448 = vmovlpd_avx(auVar40._0_16_);
    local_438 = local_448;
    local_430 = local_440;
    VVar53 = Point3<float>::operator-
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                        (Point3<float> *)in_stack_fffffffffffff798);
    local_460 = VVar53.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar41._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar41._8_56_ = auVar51;
    local_468 = vmovlpd_avx(auVar41._0_16_);
    local_458 = local_468;
    local_450 = local_460;
    VVar53 = Cross<float>((Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                          (Vector3<float> *)in_stack_fffffffffffff798);
    local_470 = VVar53.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar42._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar42._8_56_ = auVar51;
    local_478 = vmovlpd_avx(auVar42._0_16_);
    local_428 = local_478;
    local_420 = local_470;
    VVar53 = Normalize<float>((Vector3<float> *)
                              CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    local_480 = VVar53.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar43._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar43._8_56_ = auVar51;
    local_488 = vmovlpd_avx(auVar43._0_16_);
    local_418 = local_488;
    local_410 = local_480;
    Normal3<float>::Normal3<float>
              ((Normal3<float> *)CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790),
               (Vector3<float> *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
    if ((local_28->reverseOrientation & 1U) != (local_28->transformSwapsHandedness & 1U)) {
      Tuple3<pbrt::Normal3,float>::operator*=(local_40c,-1);
    }
    VVar53 = Point3<float>::operator-
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                        (Point3<float> *)in_stack_fffffffffffff798);
    local_4b0.z = VVar53.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar44._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar44._8_56_ = auVar51;
    local_4b0._0_8_ = vmovlpd_avx(auVar44._0_16_);
    local_4a0[0]._0_8_ = local_4b0._0_8_;
    local_4a0[0].z = local_4b0.z;
    VVar53 = Point3<float>::operator-
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                        (Point3<float> *)in_stack_fffffffffffff798);
    local_4d0.z = VVar53.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar45._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar45._8_56_ = auVar51;
    local_4d0._0_8_ = vmovlpd_avx(auVar45._0_16_);
    local_4c0._0_8_ = local_4d0._0_8_;
    local_4c0.z = local_4d0.z;
    Dot<float>((Vector3<float> *)local_4a0,(Vector3<float> *)&local_4c0);
    DistanceSquared<float>
              ((Point3<float> *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
               (Point3<float> *)in_stack_fffffffffffff7a8);
    auVar51 = ZEXT856(0);
    VVar53 = Point3<float>::operator-
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                        (Point3<float> *)in_stack_fffffffffffff798);
    local_4f0.z = VVar53.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar46._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar46._8_56_ = auVar51;
    local_4f0._0_8_ = vmovlpd_avx(auVar46._0_16_);
    local_4e0._0_8_ = local_4f0._0_8_;
    local_4e0.z = local_4f0.z;
    VVar53 = Point3<float>::operator-
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                        (Point3<float> *)in_stack_fffffffffffff798);
    FVar11 = (Float)((ulong)in_stack_fffffffffffff798 >> 0x20);
    local_510.z = VVar53.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar47._0_8_ = VVar53.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar47._8_56_ = auVar51;
    local_510._0_8_ = vmovlpd_avx(auVar47._0_16_);
    local_4fc._0_8_ = local_510._0_8_;
    local_4fc.z = local_510.z;
    Dot<float>((Vector3<float> *)&local_4e0,(Vector3<float> *)&local_4fc);
    DistanceSquared<float>
              ((Point3<float> *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
               (Point3<float> *)in_stack_fffffffffffff7a8);
    Point2<float>::Point2
              ((Point2<float> *)CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790),
               in_stack_fffffffffffff78c,in_stack_fffffffffffff788);
    Point3fi::Point3fi((Point3fi *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                       (Point3f *)in_stack_fffffffffffff7a8);
    Interaction::Interaction
              ((Interaction *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
               in_stack_fffffffffffff7a8,
               (Normal3f *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),FVar11,
               (Point2f *)CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790));
    local_518 = local_1cc;
    pstd::optional<pbrt::ShapeSample>::optional
              ((optional<pbrt::ShapeSample> *)
               CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790),
               (ShapeSample *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
  }
  return in_RDI;
}

Assistant:

pstd::optional<ShapeSample> BilinearPatch::Sample(const ShapeSampleContext &ctx,
                                                  Point2f u) const {
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    // Find normalized vectors to corners of bilinear patch
    Vector3f v00 = Normalize(p00 - ctx.p()), v10 = Normalize(p10 - ctx.p());
    Vector3f v01 = Normalize(p01 - ctx.p()), v11 = Normalize(p11 - ctx.p());

    if (IsRectangle() && !mesh->imageDistribution &&
        SphericalQuadArea(v00, v10, v11, v01) > MinSphericalSampleArea) {
        // Sample direction to rectanglular bilinear patch
        Float pdf = 1;
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Warp uniform sample _u_ to account for incident $\cos \theta$ factor
            // Compute $\cos \theta$ weights for rectangle seen from _ctx.p()_
            Point3f rp = ctx.p();
            pstd::array<Float, 4> w = pstd::array<Float, 4>{
                std::max<Float>(0.01, AbsDot(Normalize(p00 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p10 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p01 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p11 - rp), ctx.ns))};

            u = SampleBilinear(u, w);
            pdf *= BilinearPDF(u, w);
        }
        // Sample spherical rectangle at reference point $\pt{}$
        Float quadPDF;
        Point3f p =
            SampleSphericalRectangle(ctx.p(), p00, p10 - p00, p01 - p00, u, &quadPDF);
        pdf *= quadPDF;

        // Compute surface normal and $(u,v)$ for sampled point on rectangle
        Normal3f n = Normal3f(Normalize(Cross(p10 - p00, p01 - p00)));
        if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
            n *= -1;
        Point2f uv(Dot(p - p00, p10 - p00) / DistanceSquared(p10, p00),
                   Dot(p - p00, p01 - p00) / DistanceSquared(p01, p00));

        return ShapeSample{Interaction(p, n, ctx.time, uv), pdf};

    } else {
        // Uniformly sample shape and compute incident direction _wi_
        pstd::optional<ShapeSample> ss = Sample(u);
        DCHECK(ss.has_value());
        ss->intr.time = ctx.time;
        Vector3f wi = ss->intr.p() - ctx.p();
        if (LengthSquared(wi) == 0)
            return {};
        wi = Normalize(wi);

        // Convert uniform area sample PDF in _ss_ to solid angle measure
        ss->pdf /= AbsDot(ss->intr.n, -wi) / DistanceSquared(ctx.p(), ss->intr.p());
        if (IsInf(ss->pdf))
            return {};

        return ss;
    }
}